

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O1

bool __thiscall
SQVM::NewSlot(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *val,bool bstatic)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  SQChar *pSVar7;
  SQChar *pSVar8;
  SQMetaMethod mm;
  SQMetaMethod mm_00;
  char *s;
  SQObjectPtr res;
  SQObjectPtr closure;
  SQObjectPtr local_48;
  SQObjectPtr local_38;
  
  if ((key->super_SQObject)._type == OT_NULL) {
    s = "null cannot be used as index";
LAB_0012512c:
    bVar4 = false;
    Raise_Error(this,s);
  }
  else {
    SVar2 = (self->super_SQObject)._type;
    if (SVar2 == OT_CLASS) {
      bVar4 = SQClass::NewSlot((self->super_SQObject)._unVal.pClass,this->_sharedstate,key,val,
                               bstatic);
      if (!bVar4) {
        if (((self->super_SQObject)._unVal.pClass)->_locked != true) {
          local_48.super_SQObject._unVal.pString = PrintObjVal(this,key);
          local_48.super_SQObject._type = OT_STRING;
          pSVar1 = &((local_48.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
                    .super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
          Raise_Error(this,"the property \'%s\' already exists",
                      &(local_48.super_SQObject._unVal.pTable)->_firstfree);
          goto LAB_0012537b;
        }
        s = "trying to modify a class that has already been instantiated";
        goto LAB_0012512c;
      }
    }
    else if (SVar2 == OT_INSTANCE) {
      local_48.super_SQObject._unVal.pTable = (SQTable *)0x0;
      local_48.super_SQObject._type = OT_NULL;
      local_38.super_SQObject._unVal.pTable = (SQTable *)0x0;
      local_38.super_SQObject._type = OT_NULL;
      pSVar3 = (self->super_SQObject)._unVal.pTable;
      if (((pSVar3->super_SQDelegable)._delegate == (SQTable *)0x0) ||
         (iVar6 = (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                    _vptr_SQRefCounted[6])(pSVar3,this,0xd,&local_38), (char)iVar6 == '\0')) {
        Raise_Error(this,"class instances do not support the new slot operator");
        SQObjectPtr::~SQObjectPtr(&local_38);
LAB_0012537b:
        SQObjectPtr::~SQObjectPtr(&local_48);
        return false;
      }
      Push(this,self);
      Push(this,key);
      Push(this,val);
      bVar4 = CallMetaMethod(this,&local_38,mm,3,&local_48);
      SQObjectPtr::~SQObjectPtr(&local_38);
      SQObjectPtr::~SQObjectPtr(&local_48);
      if (!bVar4) {
        return false;
      }
    }
    else {
      if (SVar2 != OT_TABLE) {
        pSVar7 = GetTypeName(self);
        pSVar8 = GetTypeName(key);
        Raise_Error(this,"indexing %s with %s",pSVar7,pSVar8);
        return false;
      }
      pSVar3 = (self->super_SQObject)._unVal.pTable;
      if ((pSVar3->super_SQDelegable)._delegate != (SQTable *)0x0) {
        local_48.super_SQObject._unVal.pTable = (SQTable *)0x0;
        local_48.super_SQObject._type = OT_NULL;
        bVar4 = SQTable::Get(pSVar3,key,&local_48);
        if (bVar4) {
          bVar5 = false;
          bVar4 = false;
        }
        else {
          local_38.super_SQObject._unVal.pTable = (SQTable *)0x0;
          local_38.super_SQObject._type = OT_NULL;
          pSVar3 = (self->super_SQObject)._unVal.pTable;
          if (((pSVar3->super_SQDelegable)._delegate == (SQTable *)0x0) ||
             (iVar6 = (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                        _vptr_SQRefCounted[6])(pSVar3,this,0xd,&local_38), (char)iVar6 == '\0')) {
            bVar5 = false;
            bVar4 = false;
          }
          else {
            Push(this,self);
            Push(this,key);
            Push(this,val);
            bVar5 = CallMetaMethod(this,&local_38,mm_00,3,&local_48);
            bVar4 = !bVar5;
          }
          SQObjectPtr::~SQObjectPtr(&local_38);
        }
        SQObjectPtr::~SQObjectPtr(&local_48);
        if (bVar5 != false || bVar4) {
          if (bVar4) {
            return false;
          }
          goto LAB_001253b9;
        }
      }
      SQTable::NewSlot((self->super_SQObject)._unVal.pTable,key,val);
    }
LAB_001253b9:
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool SQVM::NewSlot(const SQObjectPtr &self,const SQObjectPtr &key,const SQObjectPtr &val,bool bstatic)
{
    if(sq_type(key) == OT_NULL) { Raise_Error(_SC("null cannot be used as index")); return false; }
    switch(sq_type(self)) {
    case OT_TABLE: {
        bool rawcall = true;
        if(_table(self)->_delegate) {
            SQObjectPtr res;
            if(!_table(self)->Get(key,res)) {
                SQObjectPtr closure;
                if(_delegable(self)->_delegate && _delegable(self)->GetMetaMethod(this,MT_NEWSLOT,closure)) {
                    Push(self);Push(key);Push(val);
                    if(!CallMetaMethod(closure,MT_NEWSLOT,3,res)) {
                        return false;
                    }
                    rawcall = false;
                }
                else {
                    rawcall = true;
                }
            }
        }
        if(rawcall) _table(self)->NewSlot(key,val); //cannot fail

        break;}
    case OT_INSTANCE: {
        SQObjectPtr res;
        SQObjectPtr closure;
        if(_delegable(self)->_delegate && _delegable(self)->GetMetaMethod(this,MT_NEWSLOT,closure)) {
            Push(self);Push(key);Push(val);
            if(!CallMetaMethod(closure,MT_NEWSLOT,3,res)) {
                return false;
            }
            break;
        }
        Raise_Error(_SC("class instances do not support the new slot operator"));
        return false;
        break;}
    case OT_CLASS:
        if(!_class(self)->NewSlot(_ss(this),key,val,bstatic)) {
            if(_class(self)->_locked) {
                Raise_Error(_SC("trying to modify a class that has already been instantiated"));
                return false;
            }
            else {
                SQObjectPtr oval = PrintObjVal(key);
                Raise_Error(_SC("the property '%s' already exists"),_stringval(oval));
                return false;
            }
        }
        break;
    default:
        Raise_Error(_SC("indexing %s with %s"),GetTypeName(self),GetTypeName(key));
        return false;
        break;
    }
    return true;
}